

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeNames(WasmBinaryWriter *this)

{
  pointer puVar1;
  Function *pFVar2;
  char *pcVar3;
  pointer pHVar4;
  BufferWithRandomAccess *pBVar5;
  pointer puVar6;
  Table *pTVar7;
  pointer puVar8;
  Memory *pMVar9;
  pointer puVar10;
  Global *pGVar11;
  pointer puVar12;
  ElementSegment *pEVar13;
  long lVar14;
  pointer ppVar15;
  pointer ppVar16;
  bool bVar17;
  int32_t start;
  int32_t iVar18;
  HeapTypeKind HVar19;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *seg;
  size_t sVar20;
  size_t sVar21;
  __node_base_ptr p_Var22;
  mapped_type *pmVar23;
  ulong uVar24;
  const_iterator cVar25;
  mapped_type *pmVar26;
  mapped_type *pmVar27;
  pointer puVar28;
  iterator iVar29;
  pointer puVar30;
  size_t in_RCX;
  pointer __n;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  *__n_00;
  pointer __n_01;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_06;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *__buf_07;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *__buf_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *__buf_09;
  void *extraout_RDX_11;
  void *extraout_RDX_12;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *extraout_RDX_13;
  void *extraout_RDX_14;
  void *__buf_13;
  void *extraout_RDX_15;
  void *extraout_RDX_16;
  void *pvVar31;
  mapped_type mVar32;
  _Hash_node_base *p_Var33;
  uint uVar34;
  type *index;
  pointer pHVar35;
  size_type sVar36;
  pointer ppVar37;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar38;
  pointer puVar39;
  pointer puVar40;
  pointer puVar41;
  pointer puVar42;
  Index index_00;
  int iVar43;
  type *indexInBinary;
  undefined1 auVar44 [8];
  long *plVar45;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_2;
  WasmBinaryWriter *pWVar46;
  undefined1 *puVar47;
  string_view name;
  pair<unsigned_int,_wasm::Name> local_90;
  WasmBinaryWriter *local_78;
  undefined8 local_70;
  undefined1 auStack_68 [8];
  vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  localsWithNames;
  pointer ppStack_48;
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  functionsWithNames;
  
  start = startSection<wasm::BinaryConsts::Section>(this,Custom);
  pcVar3 = BinaryConsts::CustomSections::Name;
  sVar20 = strlen(BinaryConsts::CustomSections::Name);
  name._M_str = pcVar3;
  name._M_len = sVar20;
  writeInlineString(this,name);
  if ((this->emitModuleName == true) && ((this->wasm->name).super_IString.str._M_str != (char *)0x0)
     ) {
    iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameModule);
    writeEscapedName(this,(this->wasm->name).super_IString.str);
    finishSection(this,iVar18);
  }
  if (this->debugInfo == true) {
    ppStack_48 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar38 = (this->wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar34 = 0;
    if (puVar38 != puVar1) {
      do {
        pFVar2 = (puVar38->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
          if (*(bool *)((long)&(pFVar2->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar2;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                        ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Function_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar2,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pFVar2 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          uVar34 = uVar34 + 1;
        }
        puVar38 = puVar38 + 1;
      } while (puVar38 != puVar1);
    }
    puVar38 = (this->wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar38 != puVar1) {
      do {
        pFVar2 = (puVar38->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar2->super_Importable).module + 8) == (char *)0x0) {
          if (*(bool *)((long)&(pFVar2->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar2;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                        ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Function_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar2,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pFVar2 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          uVar34 = uVar34 + 1;
        }
        puVar38 = puVar38 + 1;
      } while (puVar38 != puVar1);
    }
    if ((this->indexes).functionIndexes._M_h._M_element_count != (ulong)uVar34) {
      __assert_fail("checked == indexes.functionIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x385,"void wasm::WasmBinaryWriter::writeNames()");
    }
    if (functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != ppStack_48) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkMemInfo);
      auStack_68._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 4);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf,in_RCX);
      ppVar16 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar31 = extraout_RDX;
        ppVar37 = ppStack_48;
        do {
          auStack_68._0_4_ = ppVar37->first;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,pvVar31,in_RCX);
          writeEscapedName(this,(ppVar37->second->super_Importable).super_Named.name.super_IString.
                                str);
          ppVar37 = ppVar37 + 1;
          pvVar31 = extraout_RDX_00;
        } while (ppVar37 != ppVar16);
      }
      finishSection(this,iVar18);
    }
    if (ppStack_48 != (pointer)0x0) {
      operator_delete(ppStack_48,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
    }
    ppStack_48 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar38 = (this->wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_78 = (WasmBinaryWriter *)
               (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((WasmBinaryWriter *)puVar38 == local_78) {
      local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((ulong)local_70._4_4_ << 0x20);
    }
    else {
      local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((ulong)local_70._4_4_ << 0x20);
      do {
        pFVar2 = (puVar38->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
          sVar21 = Function::getNumLocals(pFVar2);
          if (sVar21 != 0) {
            uVar24 = 0;
            do {
              bVar17 = Function::hasLocalName(pFVar2,(Index)uVar24);
              if (bVar17) {
                auStack_68._0_4_ = (uint)local_70;
                localsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar2;
                if (functionsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    functionsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::
                  vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                  ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                            ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                              *)&ppStack_48,
                             (iterator)
                             functionsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (pair<unsigned_int,_wasm::Function_*> *)auStack_68);
                }
                else {
                  localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar2,0);
                  localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                       (undefined4)((ulong)pFVar2 >> 0x20);
                  (functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first = (uint)local_70;
                  *(undefined4 *)
                   &(functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
                  *(undefined4 *)
                   &(functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second =
                       localsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_;
                  *(undefined4 *)
                   ((long)&(functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                       localsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_;
                  functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
                }
                break;
              }
              uVar24 = (ulong)((Index)uVar24 + 1);
            } while (uVar24 < sVar21);
          }
          local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)CONCAT44(local_70._4_4_,(uint)local_70 + 1);
        }
        puVar38 = puVar38 + 1;
      } while ((WasmBinaryWriter *)puVar38 != local_78);
    }
    pWVar46 = (WasmBinaryWriter *)
              (this->wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_78 = (WasmBinaryWriter *)
               (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pWVar46 != local_78) {
      do {
        pFVar2 = (Function *)
                 (pWVar46->tableOfContents).functionBodies.
                 super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pFVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          sVar21 = Function::getNumLocals(pFVar2);
          if (sVar21 != 0) {
            uVar24 = 0;
            do {
              bVar17 = Function::hasLocalName(pFVar2,(Index)uVar24);
              if (bVar17) {
                auStack_68._0_4_ = (uint)local_70;
                localsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar2;
                if (functionsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    functionsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::
                  vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                  ::_M_realloc_insert<std::pair<unsigned_int,wasm::Function*>>
                            ((vector<std::pair<unsigned_int,wasm::Function*>,std::allocator<std::pair<unsigned_int,wasm::Function*>>>
                              *)&ppStack_48,
                             (iterator)
                             functionsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (pair<unsigned_int,_wasm::Function_*> *)auStack_68);
                }
                else {
                  localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pFVar2,0);
                  localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                       (undefined4)((ulong)pFVar2 >> 0x20);
                  (functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first = (uint)local_70;
                  *(undefined4 *)
                   &(functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
                  *(undefined4 *)
                   &(functionsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second =
                       localsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_;
                  *(undefined4 *)
                   ((long)&(functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                       localsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_;
                  functionsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
                }
                break;
              }
              uVar24 = (ulong)((Index)uVar24 + 1);
            } while (uVar24 < sVar21);
          }
          local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)CONCAT44(local_70._4_4_,(uint)local_70 + 1);
        }
        pWVar46 = (WasmBinaryWriter *)
                  &(pWVar46->tableOfContents).functionBodies.
                   super__Vector_base<wasm::WasmBinaryWriter::TableOfContents::Entry,_std::allocator<wasm::WasmBinaryWriter::TableOfContents::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (pWVar46 != local_78);
    }
    if ((this->indexes).functionIndexes._M_h._M_element_count != ((ulong)local_70 & 0xffffffff)) {
      __assert_fail("checked == indexes.functionIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x3a4,"void wasm::WasmBinaryWriter::writeNames()");
    }
    if (functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != ppStack_48) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkNeeded);
      auStack_68._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 4);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf_00,in_RCX);
      ppVar16 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      in_RCX = 0;
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_70 = &(this->funcMappedLocals)._M_h;
        ppVar37 = ppStack_48;
        local_78 = this;
        do {
          auStack_68 = (undefined1  [8])0x0;
          localsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          localsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          sVar21 = Function::getNumLocals(ppVar37->second);
          if (sVar21 != 0) {
            uVar24 = 0;
            do {
              index_00 = (Index)uVar24;
              bVar17 = Function::hasLocalName(ppVar37->second,index_00);
              if (bVar17) {
                pcVar3 = (ppVar37->second->super_Importable).super_Named.name.super_IString.str.
                         _M_str;
                p_Var22 = std::
                          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::_M_find_before_node
                                    (local_70,(ulong)pcVar3 %
                                              (this->funcMappedLocals)._M_h._M_bucket_count,
                                     (key_type *)ppVar37->second,(__hash_code)pcVar3);
                if (p_Var22 == (__node_base_ptr)0x0) {
                  p_Var33 = (_Hash_node_base *)0x0;
                }
                else {
                  p_Var33 = p_Var22->_M_nxt;
                }
                if (p_Var33 == (_Hash_node_base *)0x0) {
                  mVar32 = index_00;
                  if ((ppVar37->second->super_Importable).module.super_IString.str._M_str ==
                      (char *)0x0) {
                    __assert_fail("func->imported()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                                  ,0x3bb,"void wasm::WasmBinaryWriter::writeNames()");
                  }
                }
                else {
                  local_90._4_4_ = 0;
                  local_90.first = index_00;
                  pmVar23 = std::__detail::
                            _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)(p_Var33 + 3),(key_type *)&local_90);
                  mVar32 = (mapped_type)*pmVar23;
                }
                local_90.second = Function::getLocalName(ppVar37->second,index_00);
                local_90.first = mVar32;
                if (localsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    localsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::
                  vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>
                  ::_M_realloc_insert<std::pair<unsigned_int,wasm::Name>>
                            ((vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>
                              *)auStack_68,
                             (iterator)
                             localsWithNames.
                             super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,&local_90);
                  this = local_78;
                }
                else {
                  ((localsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second).super_IString.str._M_str =
                       local_90.second.super_IString.str._M_str;
                  *(ulong *)localsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                       CONCAT44(local_90._4_4_,mVar32);
                  ((localsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second).super_IString.str._M_len =
                       local_90.second.super_IString.str._M_len;
                  localsWithNames.
                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       localsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
                  this = local_78;
                }
              }
              uVar24 = (ulong)(index_00 + 1);
            } while (uVar24 < sVar21);
          }
          ppVar15 = localsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar44 = auStack_68;
          if ((long)localsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68 == 0) {
            __assert_fail("localsWithNames.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                          ,0x3c2,"void wasm::WasmBinaryWriter::writeNames()");
          }
          sVar20 = 0xaaaaaaaaaaaaaaab;
          uVar24 = ((long)localsWithNames.
                          super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68 >> 3) *
                   -0x5555555555555555;
          lVar14 = 0x3f;
          if (uVar24 != 0) {
            for (; uVar24 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::Name>*,std::vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (auStack_68,
                     localsWithNames.
                     super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::Name>*,std::vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (auVar44,ppVar15);
          local_90.first = ppVar37->first;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&local_90,(int)this->o,__buf_01,sVar20);
          local_90.first =
               (int)((ulong)((long)localsWithNames.
                                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68) >>
                    3) * -0x55555555;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&local_90,(int)this->o,__buf_02,sVar20);
          ppVar15 = localsWithNames.
                    super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar31 = extraout_RDX_01;
          for (auVar44 = auStack_68; auVar44 != (undefined1  [8])ppVar15;
              auVar44 = (undefined1  [8])((long)auVar44 + 0x18)) {
            local_90.first = ((pointer)auVar44)->first;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)&local_90,(int)this->o,pvVar31,sVar20);
            writeEscapedName(this,(((pointer)auVar44)->second).super_IString.str);
            pvVar31 = extraout_RDX_02;
          }
          if (auStack_68 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_68,
                            (long)localsWithNames.
                                  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
          }
          uVar34 = (int)in_RCX + 1;
          in_RCX = (size_t)uVar34;
          ppVar37 = ppVar37 + 1;
        } while (ppVar37 != ppVar16);
        in_RCX = (size_t)uVar34;
      }
      if ((long)functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48 >> 4 != in_RCX) {
        __assert_fail("emitted == functionsWithLocalNames.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                      ,0x3cc,"void wasm::WasmBinaryWriter::writeNames()");
      }
      finishSection(this,iVar18);
    }
    if (ppStack_48 != (pointer)0x0) {
      operator_delete(ppStack_48,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
    }
    ppStack_48 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pHVar35 = (this->indexedTypes).types.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar4 = (this->indexedTypes).types.
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pHVar35 != pHVar4) {
      do {
        auStack_68 = (undefined1  [8])pHVar35->id;
        cVar25 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->wasm->typeNames)._M_h,(key_type *)auStack_68);
        if ((cVar25.
             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
             _M_cur != (__node_type *)0x0) &&
           (pmVar26 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->wasm->typeNames,(key_type *)auStack_68),
           (pmVar26->name).super_IString.str._M_str != (char *)0x0)) {
          if (functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&ppStack_48,
                       (iterator)
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(key_type *)auStack_68);
          }
          else {
            *(undefined1 (*) [8])
             functionsWithNames.
             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start = auStack_68;
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&(functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->second;
          }
        }
        pHVar35 = pHVar35 + 1;
      } while (pHVar35 != pHVar4);
    }
    if (ppStack_48 !=
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameType);
      local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)CONCAT44(local_70._4_4_,iVar18);
      auStack_68._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 3);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf_03,in_RCX);
      ppVar16 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        ppVar37 = ppStack_48;
        do {
          auStack_68 = *(undefined1 (*) [8])ppVar37;
          pBVar5 = this->o;
          pmVar27 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->indexedTypes).indices,(key_type *)auStack_68);
          local_90.first = *pmVar27;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&local_90,(int)pBVar5,__buf_04,in_RCX);
          pmVar26 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->wasm->typeNames,(key_type *)auStack_68);
          writeEscapedName(this,(pmVar26->name).super_IString.str);
          ppVar37 = (pointer)&ppVar37->second;
        } while (ppVar37 != ppVar16);
      }
      finishSection(this,(uint)local_70);
    }
    if (ppStack_48 != (pointer)0x0) {
      operator_delete(ppStack_48,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
    }
    ppStack_48 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar39 = (this->wasm->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar36 = 0;
    if (puVar39 != puVar6) {
      do {
        pTVar7 = (puVar39->_M_t).
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        if (*(char **)((long)&(pTVar7->super_Importable).module + 8) != (char *)0x0) {
          uVar34 = (uint)sVar36;
          if (*(bool *)((long)&(pTVar7->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar7;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Table*>>
                        ((vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Table_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar7,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pTVar7 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar36 = (size_type)(uVar34 + 1);
        }
        puVar39 = puVar39 + 1;
      } while (puVar39 != puVar6);
    }
    puVar39 = (this->wasm->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar39 != puVar6) {
      do {
        pTVar7 = (puVar39->_M_t).
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        if (*(char **)((long)&(pTVar7->super_Importable).module + 8) == (char *)0x0) {
          uVar34 = (uint)sVar36;
          if (*(bool *)((long)&(pTVar7->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar7;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Table*>>
                        ((vector<std::pair<unsigned_int,wasm::Table*>,std::allocator<std::pair<unsigned_int,wasm::Table*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Table_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar7,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pTVar7 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar36 = (size_type)(uVar34 + 1);
        }
        puVar39 = puVar39 + 1;
      } while (puVar39 != puVar6);
    }
    if ((this->indexes).tableIndexes._M_h._M_element_count != sVar36) {
      __assert_fail("checked == indexes.tableIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x3f1,"void wasm::WasmBinaryWriter::writeNames()");
    }
    if (functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != ppStack_48) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameTable);
      auStack_68._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 4);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf_05,in_RCX);
      ppVar16 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar31 = extraout_RDX_03;
        ppVar37 = ppStack_48;
        do {
          auStack_68._0_4_ = ppVar37->first;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,pvVar31,in_RCX);
          writeEscapedName(this,(ppVar37->second->super_Importable).super_Named.name.super_IString.
                                str);
          ppVar37 = ppVar37 + 1;
          pvVar31 = extraout_RDX_04;
        } while (ppVar37 != ppVar16);
      }
      finishSection(this,iVar18);
    }
    if (ppStack_48 != (pointer)0x0) {
      operator_delete(ppStack_48,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
    }
    ppStack_48 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar40 = (this->wasm->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar36 = 0;
    if (puVar40 != puVar8) {
      do {
        pMVar9 = (puVar40->_M_t).
                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        if (*(char **)((long)&(pMVar9->super_Importable).module + 8) != (char *)0x0) {
          uVar34 = (uint)sVar36;
          if (*(bool *)((long)&(pMVar9->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pMVar9;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Memory*>>
                        ((vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Memory_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pMVar9,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pMVar9 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar36 = (size_type)(uVar34 + 1);
        }
        puVar40 = puVar40 + 1;
      } while (puVar40 != puVar8);
    }
    puVar40 = (this->wasm->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar40 != puVar8) {
      do {
        pMVar9 = (puVar40->_M_t).
                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        if (*(char **)((long)&(pMVar9->super_Importable).module + 8) == (char *)0x0) {
          uVar34 = (uint)sVar36;
          if (*(bool *)((long)&(pMVar9->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pMVar9;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Memory*>>
                        ((vector<std::pair<unsigned_int,wasm::Memory*>,std::allocator<std::pair<unsigned_int,wasm::Memory*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Memory_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pMVar9,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pMVar9 >> 0x20);
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar36 = (size_type)(uVar34 + 1);
        }
        puVar40 = puVar40 + 1;
      } while (puVar40 != puVar8);
    }
    if ((this->indexes).memoryIndexes._M_h._M_element_count != sVar36) {
      __assert_fail("checked == indexes.memoryIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x40d,"void wasm::WasmBinaryWriter::writeNames()");
    }
    if (functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != ppStack_48) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameMemory);
      auStack_68._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 4);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf_06,in_RCX);
      ppVar16 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar31 = extraout_RDX_05;
        ppVar37 = ppStack_48;
        do {
          auStack_68._0_4_ = ppVar37->first;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,pvVar31,in_RCX);
          writeEscapedName(this,(ppVar37->second->super_Importable).super_Named.name.super_IString.
                                str);
          ppVar37 = ppVar37 + 1;
          pvVar31 = extraout_RDX_06;
        } while (ppVar37 != ppVar16);
      }
      finishSection(this,iVar18);
    }
    if (ppStack_48 != (pointer)0x0) {
      operator_delete(ppStack_48,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
    }
    ppStack_48 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar41 = (this->wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (this->wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar36 = 0;
    if (puVar41 != puVar10) {
      do {
        pGVar11 = (puVar41->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar11->super_Importable).module + 8) != (char *)0x0) {
          uVar34 = (uint)sVar36;
          if (*(bool *)((long)&(pGVar11->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar11;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Global*>>
                        ((vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Global_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pGVar11,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pGVar11 >> 0x20)
              ;
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar36 = (size_type)(uVar34 + 1);
        }
        puVar41 = puVar41 + 1;
      } while (puVar41 != puVar10);
    }
    puVar41 = (this->wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (this->wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar41 != puVar10) {
      do {
        pGVar11 = (puVar41->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar11->super_Importable).module + 8) == (char *)0x0) {
          uVar34 = (uint)sVar36;
          if (*(bool *)((long)&(pGVar11->super_Importable).super_Named + 0x10) == true) {
            auStack_68._0_4_ = uVar34;
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar11;
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
              ::_M_realloc_insert<std::pair<unsigned_int,wasm::Global*>>
                        ((vector<std::pair<unsigned_int,wasm::Global*>,std::allocator<std::pair<unsigned_int,wasm::Global*>>>
                          *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pair<unsigned_int,_wasm::Global_*> *)auStack_68);
            }
            else {
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pGVar11,0);
              localsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pGVar11 >> 0x20)
              ;
              (functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
              *(undefined4 *)
               &(functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)
               ((long)&(functionsWithNames.
                        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                   localsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   functionsWithNames.
                   super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          sVar36 = (size_type)(uVar34 + 1);
        }
        puVar41 = puVar41 + 1;
      } while (puVar41 != puVar10);
    }
    if ((this->indexes).globalIndexes._M_h._M_element_count != sVar36) {
      __assert_fail("checked == indexes.globalIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x426,"void wasm::WasmBinaryWriter::writeNames()");
    }
    if (functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != ppStack_48) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameGlobal);
      auStack_68._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 4);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf_07,in_RCX);
      ppVar16 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar31 = extraout_RDX_07;
        ppVar37 = ppStack_48;
        do {
          auStack_68._0_4_ = ppVar37->first;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,pvVar31,in_RCX);
          writeEscapedName(this,(ppVar37->second->super_Importable).super_Named.name.super_IString.
                                str);
          ppVar37 = ppVar37 + 1;
          pvVar31 = extraout_RDX_08;
        } while (ppVar37 != ppVar16);
      }
      finishSection(this,iVar18);
    }
    if (ppStack_48 != (pointer)0x0) {
      operator_delete(ppStack_48,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
    }
    ppStack_48 = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionsWithNames.
    super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar42 = (this->wasm->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (this->wasm->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar36 = 0;
    if (puVar42 != puVar12) {
      do {
        uVar34 = (uint)sVar36;
        if ((((puVar42->_M_t).
              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->super_Named).
            hasExplicitName == true) {
          pEVar13 = (puVar42->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
          auStack_68._0_4_ = uVar34;
          localsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar13;
          if (functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<unsigned_int,wasm::ElementSegment*>,std::allocator<std::pair<unsigned_int,wasm::ElementSegment*>>>
            ::_M_realloc_insert<std::pair<unsigned_int,wasm::ElementSegment*>>
                      ((vector<std::pair<unsigned_int,wasm::ElementSegment*>,std::allocator<std::pair<unsigned_int,wasm::ElementSegment*>>>
                        *)&ppStack_48,
                       (iterator)
                       functionsWithNames.
                       super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<unsigned_int,_wasm::ElementSegment_*> *)auStack_68);
          }
          else {
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pEVar13,0);
            localsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pEVar13 >> 0x20);
            (functionsWithNames.
             super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = uVar34;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_68._4_4_;
            *(undefined4 *)
             &(functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
            *(undefined4 *)
             ((long)&(functionsWithNames.
                      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second + 4) =
                 localsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
            functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 functionsWithNames.
                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        sVar36 = (size_type)(uVar34 + 1);
        puVar42 = puVar42 + 1;
      } while (puVar42 != puVar12);
      sVar36 = (size_type)(uVar34 + 1);
    }
    if ((this->indexes).elemIndexes._M_h._M_element_count != sVar36) {
      __assert_fail("checked == indexes.elemIndexes.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x43d,"void wasm::WasmBinaryWriter::writeNames()");
    }
    if (functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != ppStack_48) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameElem);
      auStack_68._0_4_ =
           (int)((ulong)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 4);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf_08,in_RCX);
      ppVar16 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar31 = extraout_RDX_09;
        ppVar37 = ppStack_48;
        do {
          auStack_68._0_4_ = ppVar37->first;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,pvVar31,in_RCX);
          writeEscapedName(this,(ppVar37->second->super_Importable).super_Named.name.super_IString.
                                str);
          ppVar37 = ppVar37 + 1;
          pvVar31 = extraout_RDX_10;
        } while (ppVar37 != ppVar16);
      }
      finishSection(this,iVar18);
    }
    if (ppStack_48 != (pointer)0x0) {
      operator_delete(ppStack_48,
                      (long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
    }
    __n = (this->wasm->dataSegments).
          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    iVar43 = 0;
    for (puVar28 = (this->wasm->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar28 != __n; puVar28 = puVar28 + 1)
    {
      iVar43 = iVar43 + (uint)(((puVar28->_M_t).
                                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->
                              super_Named).hasExplicitName;
    }
    if (iVar43 != 0) {
      iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameData);
      local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)CONCAT44(local_70._4_4_,iVar18);
      ppStack_48 = (pointer)CONCAT44(ppStack_48._4_4_,iVar43);
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)&ppStack_48,(int)this->o,__buf_09,(size_t)__n);
      puVar28 = (this->wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->wasm->dataSegments).
          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != puVar28) {
        uVar34 = 1;
        uVar24 = 0;
        pvVar31 = extraout_RDX_11;
        do {
          if (((puVar28[uVar24]._M_t.
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->super_Named).
              hasExplicitName == true) {
            ppStack_48 = (pointer)CONCAT44(ppStack_48._4_4_,uVar34 - 1);
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)&ppStack_48,(int)this->o,pvVar31,
                       (size_t)__n);
            writeEscapedName(this,*(string_view *)
                                   &((puVar28[uVar24]._M_t.
                                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                     _M_head_impl)->super_Named).name);
            pvVar31 = extraout_RDX_12;
          }
          uVar24 = (ulong)uVar34;
          puVar28 = (this->wasm->dataSegments).
                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar34 = uVar34 + 1;
        } while (uVar24 < (ulong)((long)(this->wasm->dataSegments).
                                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar28
                                 >> 3));
      }
      finishSection(this,(uint)local_70);
    }
    if (((this->wasm->features).features & 0x400) != 0) {
      ppStack_48 = (pointer)0x0;
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pHVar35 = (this->indexedTypes).types.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_start;
      pHVar4 = (this->indexedTypes).types.
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pHVar35 != pHVar4) {
        do {
          HVar19 = HeapType::getKind(pHVar35);
          if (((HVar19 == Struct) &&
              (cVar25 = std::
                        _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&(this->wasm->typeNames)._M_h,pHVar35),
              cVar25.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
              _M_cur != (__node_type *)0x0)) &&
             (pmVar26 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this->wasm->typeNames,pHVar35),
             (pmVar26->fieldNames)._M_h._M_element_count != 0)) {
            if (functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
              _M_realloc_insert<wasm::HeapType_const&>
                        ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&ppStack_48,
                         (iterator)
                         functionsWithNames.
                         super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,pHVar35);
            }
            else {
              *(uintptr_t *)
               functionsWithNames.
               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start = pHVar35->id;
              functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&(functionsWithNames.
                              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->second;
            }
          }
          pHVar35 = pHVar35 + 1;
        } while (pHVar35 != pHVar4);
      }
      if (ppStack_48 !=
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameField);
        local_78 = (WasmBinaryWriter *)CONCAT44(local_78._4_4_,iVar18);
        auStack_68._0_4_ =
             (int)((ulong)((long)functionsWithNames.
                                 super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48) >> 3)
        ;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)auStack_68,(int)this->o,__buf_10,(size_t)__n)
        ;
        if (functionsWithNames.
            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != ppStack_48) {
          __n_00 = &(this->indexedTypes).indices;
          puVar47 = (undefined1 *)0x0;
          local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)__n_00;
          do {
            auStack_68 = *(undefined1 (*) [8])(&ppStack_48->first + (long)puVar47 * 2);
            pBVar5 = this->o;
            pmVar27 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_70,(key_type *)auStack_68);
            local_90.first = *pmVar27;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)&local_90,(int)pBVar5,__buf_11,
                       (size_t)__n_00);
            iVar29 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->wasm->typeNames)._M_h,(key_type *)auStack_68);
            if (iVar29.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            local_90.first =
                 *(mapped_type *)
                  ((long)iVar29.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                         ._M_cur + 0x38);
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)&local_90,(int)this->o,__buf_12,
                       (size_t)__n_00);
            plVar45 = (long *)((long)iVar29.
                                     super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                     ._M_cur + 0x30);
            pvVar31 = extraout_RDX_13;
            while (plVar45 = (long *)*plVar45, plVar45 != (long *)0x0) {
              local_90.first = *(uint *)(plVar45 + 1);
              LEB<unsigned_int,_unsigned_char>::write
                        ((LEB<unsigned_int,_unsigned_char> *)&local_90,(int)this->o,pvVar31,
                         (size_t)__n_00);
              writeEscapedName(this,*(string_view *)(plVar45 + 2));
              pvVar31 = extraout_RDX_14;
            }
            puVar47 = (undefined1 *)(ulong)((int)puVar47 + 1);
            __n_00 = (unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                      *)((long)functionsWithNames.
                               super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_48 >> 3);
          } while (puVar47 < __n_00);
        }
        finishSection(this,(int32_t)local_78);
      }
      if (ppStack_48 != (pointer)0x0) {
        operator_delete(ppStack_48,
                        (long)functionsWithNames.
                              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_48);
      }
    }
    puVar30 = (this->wasm->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n_01 = (this->wasm->tags).
             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar30 != __n_01) {
      iVar43 = 0;
      do {
        iVar43 = iVar43 + (uint)*(bool *)((long)&(((puVar30->_M_t).
                                                                                                      
                                                  super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                                  .super__Head_base<0UL,_wasm::Tag_*,_false>.
                                                  _M_head_impl)->super_Importable).super_Named +
                                         0x10);
        puVar30 = puVar30 + 1;
      } while (puVar30 != __n_01);
      if (iVar43 != 0) {
        iVar18 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameTag);
        local_70 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)CONCAT44(local_70._4_4_,iVar18);
        ppStack_48 = (pointer)CONCAT44(ppStack_48._4_4_,iVar43);
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)&ppStack_48,(int)this->o,__buf_13,
                   (size_t)__n_01);
        puVar30 = (this->wasm->tags).
                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->wasm->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != puVar30) {
          uVar34 = 1;
          uVar24 = 0;
          pvVar31 = extraout_RDX_15;
          do {
            if (*(bool *)((long)&((puVar30[uVar24]._M_t.
                                   super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                   .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->
                                 super_Importable).super_Named + 0x10) == true) {
              ppStack_48 = (pointer)CONCAT44(ppStack_48._4_4_,uVar34 - 1);
              LEB<unsigned_int,_unsigned_char>::write
                        ((LEB<unsigned_int,_unsigned_char> *)&ppStack_48,(int)this->o,pvVar31,
                         (size_t)__n_01);
              writeEscapedName(this,*(string_view *)
                                     &((puVar30[uVar24]._M_t.
                                        super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                        .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->
                                      super_Importable).super_Named);
              pvVar31 = extraout_RDX_16;
            }
            uVar24 = (ulong)uVar34;
            puVar30 = (this->wasm->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar34 = uVar34 + 1;
          } while (uVar24 < (ulong)((long)(this->wasm->tags).
                                          super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar30
                                   >> 3));
        }
        finishSection(this,(uint)local_70);
      }
    }
  }
  finishSection(this,start);
  return;
}

Assistant:

void WasmBinaryWriter::writeNames() {
  auto start = startSection(BinaryConsts::Section::Custom);
  writeInlineString(BinaryConsts::CustomSections::Name);

  // module name
  if (emitModuleName && wasm->name.is()) {
    auto substart =
      startSubsection(BinaryConsts::CustomSections::Subsection::NameModule);
    writeEscapedName(wasm->name.str);
    finishSubsection(substart);
  }

  if (!debugInfo) {
    // We were only writing the module name.
    finishSection(start);
    return;
  }

  // function names
  {
    std::vector<std::pair<Index, Function*>> functionsWithNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      if (curr->hasExplicitName) {
        functionsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameFunction);
      o << U32LEB(functionsWithNames.size());
      for (auto& [index, global] : functionsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // local names
  {
    // Find all functions with at least one local name and only emit the
    // subsection if there is at least one.
    std::vector<std::pair<Index, Function*>> functionsWithLocalNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      auto numLocals = curr->getNumLocals();
      for (Index i = 0; i < numLocals; ++i) {
        if (curr->hasLocalName(i)) {
          functionsWithLocalNames.push_back({checked, curr});
          break;
        }
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithLocalNames.size() > 0) {
      // Otherwise emit those functions but only include locals with a name.
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameLocal);
      o << U32LEB(functionsWithLocalNames.size());
      Index emitted = 0;
      for (auto& [index, func] : functionsWithLocalNames) {
        // Pairs of (local index in IR, name).
        std::vector<std::pair<Index, Name>> localsWithNames;
        auto numLocals = func->getNumLocals();
        for (Index indexInFunc = 0; indexInFunc < numLocals; ++indexInFunc) {
          if (func->hasLocalName(indexInFunc)) {
            Index indexInBinary;
            auto iter = funcMappedLocals.find(func->name);
            if (iter != funcMappedLocals.end()) {
              // TODO: handle multivalue
              indexInBinary = iter->second[{indexInFunc, 0}];
            } else {
              // No data on funcMappedLocals. That is only possible if we are an
              // imported function, where there are no locals to map, and in
              // that case the index is unchanged anyhow: parameters always have
              // the same index, they are not mapped in any way.
              assert(func->imported());
              indexInBinary = indexInFunc;
            }
            localsWithNames.push_back(
              {indexInBinary, func->getLocalName(indexInFunc)});
          }
        }
        assert(localsWithNames.size());
        std::sort(localsWithNames.begin(), localsWithNames.end());
        o << U32LEB(index);
        o << U32LEB(localsWithNames.size());
        for (auto& [indexInBinary, name] : localsWithNames) {
          o << U32LEB(indexInBinary);
          writeEscapedName(name.str);
        }
        emitted++;
      }
      assert(emitted == functionsWithLocalNames.size());
      finishSubsection(substart);
    }
  }

  // type names
  {
    std::vector<HeapType> namedTypes;
    for (auto type : indexedTypes.types) {
      if (wasm->typeNames.count(type) && wasm->typeNames[type].name.is()) {
        namedTypes.push_back(type);
      }
    }
    if (!namedTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameType);
      o << U32LEB(namedTypes.size());
      for (auto type : namedTypes) {
        o << U32LEB(indexedTypes.indices[type]);
        writeEscapedName(wasm->typeNames[type].name.str);
      }
      finishSubsection(substart);
    }
  }

  // table names
  {
    std::vector<std::pair<Index, Table*>> tablesWithNames;
    Index checked = 0;
    auto check = [&](Table* curr) {
      if (curr->hasExplicitName) {
        tablesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedTables(*wasm, check);
    ModuleUtils::iterDefinedTables(*wasm, check);
    assert(checked == indexes.tableIndexes.size());

    if (tablesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTable);
      o << U32LEB(tablesWithNames.size());

      for (auto& [index, table] : tablesWithNames) {
        o << U32LEB(index);
        writeEscapedName(table->name.str);
      }

      finishSubsection(substart);
    }
  }

  // memory names
  {
    std::vector<std::pair<Index, Memory*>> memoriesWithNames;
    Index checked = 0;
    auto check = [&](Memory* curr) {
      if (curr->hasExplicitName) {
        memoriesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedMemories(*wasm, check);
    ModuleUtils::iterDefinedMemories(*wasm, check);
    assert(checked == indexes.memoryIndexes.size());
    if (memoriesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameMemory);
      o << U32LEB(memoriesWithNames.size());
      for (auto& [index, memory] : memoriesWithNames) {
        o << U32LEB(index);
        writeEscapedName(memory->name.str);
      }
      finishSubsection(substart);
    }
  }

  // global names
  {
    std::vector<std::pair<Index, Global*>> globalsWithNames;
    Index checked = 0;
    auto check = [&](Global* curr) {
      if (curr->hasExplicitName) {
        globalsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedGlobals(*wasm, check);
    ModuleUtils::iterDefinedGlobals(*wasm, check);
    assert(checked == indexes.globalIndexes.size());
    if (globalsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameGlobal);
      o << U32LEB(globalsWithNames.size());
      for (auto& [index, global] : globalsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // elem segment names
  {
    std::vector<std::pair<Index, ElementSegment*>> elemsWithNames;
    Index checked = 0;
    for (auto& curr : wasm->elementSegments) {
      if (curr->hasExplicitName) {
        elemsWithNames.push_back({checked, curr.get()});
      }
      checked++;
    }
    assert(checked == indexes.elemIndexes.size());

    if (elemsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameElem);
      o << U32LEB(elemsWithNames.size());

      for (auto& [index, elem] : elemsWithNames) {
        o << U32LEB(index);
        writeEscapedName(elem->name.str);
      }

      finishSubsection(substart);
    }
  }

  // data segment names
  {
    Index count = 0;
    for (auto& seg : wasm->dataSegments) {
      if (seg->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameData);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->dataSegments.size(); i++) {
        auto& seg = wasm->dataSegments[i];
        if (seg->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(seg->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // TODO: label, type, and element names
  // see: https://github.com/WebAssembly/extended-name-section

  // GC field names
  if (wasm->features.hasGC()) {
    std::vector<HeapType> relevantTypes;
    for (auto& type : indexedTypes.types) {
      if (type.isStruct() && wasm->typeNames.count(type) &&
          !wasm->typeNames[type].fieldNames.empty()) {
        relevantTypes.push_back(type);
      }
    }
    if (!relevantTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameField);
      o << U32LEB(relevantTypes.size());
      for (Index i = 0; i < relevantTypes.size(); i++) {
        auto type = relevantTypes[i];
        o << U32LEB(indexedTypes.indices[type]);
        std::unordered_map<Index, Name>& fieldNames =
          wasm->typeNames.at(type).fieldNames;
        o << U32LEB(fieldNames.size());
        for (auto& [index, name] : fieldNames) {
          o << U32LEB(index);
          writeEscapedName(name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // tag names
  if (!wasm->tags.empty()) {
    Index count = 0;
    for (auto& tag : wasm->tags) {
      if (tag->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTag);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->tags.size(); i++) {
        auto& tag = wasm->tags[i];
        if (tag->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(tag->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  finishSection(start);
}